

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t prefix_w(wchar_t *start,wchar_t *end,wchar_t *test)

{
  bool bVar1;
  wchar_t *local_28;
  wchar_t *test_local;
  wchar_t *end_local;
  wchar_t *start_local;
  
  if (start == end) {
    start_local._4_4_ = L'\0';
  }
  else {
    end_local = start + 1;
    local_28 = test + 1;
    if (*start == *test) {
      do {
        bVar1 = false;
        if (end_local < end) {
          bVar1 = *end_local == *local_28;
          local_28 = local_28 + 1;
          end_local = end_local + 1;
        }
      } while (bVar1);
      if (end_local < end) {
        start_local._4_4_ = L'\0';
      }
      else {
        start_local._4_4_ = L'\x01';
      }
    }
    else {
      start_local._4_4_ = L'\0';
    }
  }
  return start_local._4_4_;
}

Assistant:

static int
prefix_w(const wchar_t *start, const wchar_t *end, const wchar_t *test)
{
	if (start == end)
		return (0);

	if (*start++ != *test++)
		return (0);

	while (start < end  &&  *start++ == *test++)
		;

	if (start < end)
		return (0);

	return (1);
}